

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaBasicItemPtr
xmlSchemaParseElement
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int *isElemRef,
          int topLevel)

{
  xmlNodePtr *flags;
  byte *pbVar1;
  _xmlAttr *p_Var2;
  xmlDictPtr pxVar3;
  undefined4 uVar4;
  xmlChar *pxVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  xmlAttrPtr pxVar9;
  xmlNodePtr pxVar10;
  xmlSchemaTypePtr pxVar11;
  xmlSchemaParticlePtr item;
  xmlSchemaParticlePtr __s;
  xmlSchemaTreeItemPtr_conflict *ppxVar12;
  xmlChar *pxVar13;
  xmlNodePtr pxVar14;
  xmlNodePtr pxVar15;
  xmlNs *pxVar16;
  xmlSchemaParticlePtr pxVar17;
  xmlSchemaAnnotPtr pxVar18;
  _xmlNode *p_Var19;
  _xmlSchemaType *p_Var20;
  xmlSchemaQNameRefPtr pxVar21;
  int *piVar22;
  xmlAttrPtr attr;
  char *attr_00;
  xmlNodePtr pxVar23;
  xmlChar *name_00;
  xmlSchemaBasicItemPtr ownerComp;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr pxVar24;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlChar *name_01;
  xmlChar *name_02;
  xmlParserErrors error;
  char *str2;
  undefined4 in_register_00000084;
  xmlAttrPtr attr_01;
  char *child;
  xmlSchemaTreeItemPtr_conflict *in_R9;
  char *uri;
  xmlSchemaPtr schema_00;
  _xmlAttr **pp_Var25;
  xmlHashTablePtr pxVar26;
  xmlChar **in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  char cVar27;
  xmlSchemaPtr in_stack_ffffffffffffff68;
  undefined8 uVar28;
  xmlSchemaParserCtxtPtr in_stack_ffffffffffffff70;
  xmlSchemaParticlePtr pxVar29;
  xmlSchemaAnnotPtr local_70;
  _xmlSchemaType *local_50;
  xmlChar *name;
  xmlChar *refNs;
  _xmlSchemaType *local_38;
  
  child = (char *)CONCAT44(in_register_00000084,topLevel);
  if (isElemRef != (int *)0x0) {
    *isElemRef = 0;
  }
  piVar22 = isElemRef;
  pxVar9 = xmlSchemaGetPropNode(node,"name");
  pxVar10 = (xmlNodePtr)xmlSchemaGetPropNode(node,"ref");
  if (pxVar9 == (xmlAttrPtr)0x0 && (pxVar10 == (xmlNodePtr)0x0 || topLevel != 0)) {
    xmlSchemaPMissingAttrErr
              (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1e5709,
               (xmlNodePtr)
               CONCAT71((int7)((ulong)piVar22 >> 8),pxVar10 == (xmlNodePtr)0x0 || topLevel != 0),
               child,(char *)in_R9);
    return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
  }
  xmlSchemaPValAttrID(ctxt,node,name_00);
  schema_00 = (xmlSchemaPtr)node->children;
  if (schema_00 == (xmlSchemaPtr)0x0) {
    schema_00 = (xmlSchemaPtr)0x0;
LAB_001add6a:
    local_70 = (xmlSchemaAnnotPtr)0x0;
  }
  else {
    if ((((xmlNs *)schema_00->attrgrpDecl == (xmlNs *)0x0) ||
        (iVar6 = xmlStrEqual(schema_00->version,"annotation"), iVar6 == 0)) ||
       (iVar6 = xmlStrEqual(((xmlNs *)schema_00->attrgrpDecl)->href,
                            (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0))
    goto LAB_001add6a;
    local_70 = xmlSchemaParseAnnotation(ctxt,(xmlNodePtr)schema_00,1);
    schema_00 = *(xmlSchemaPtr *)&schema_00->flags;
  }
  if (topLevel == 0) {
    uVar7 = xmlGetMinOccurs(ctxt,node,-1,0x1efeff,(int)child,(char *)in_R9);
    child = "(xs:nonNegativeInteger | unbounded)";
    iVar6 = xmlGetMaxOccurs(ctxt,node,0,0x40000000,0x1eff15,(char *)in_R9);
    xmlSchemaPCheckParticleCorrect_2
              (ctxt,(xmlSchemaParticlePtr)node,(xmlNodePtr)(ulong)uVar7,iVar6,(int)child);
    item = xmlSchemaAddParticle(ctxt,node,uVar7,iVar6);
    if (item == (xmlSchemaParticlePtr)0x0) {
      if (local_70 == (xmlSchemaAnnotPtr)0x0) {
        return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
      }
      goto LAB_001adf93;
    }
    in_stack_ffffffffffffff68 = schema_00;
    in_stack_ffffffffffffff70 = ctxt;
    if (pxVar10 == (xmlNodePtr)0x0) goto LAB_001add7d;
    refNs = (xmlChar *)0x0;
    name = (xmlChar *)0x0;
    if (isElemRef != (int *)0x0) {
      *isElemRef = 1;
    }
    attr_01 = (xmlAttrPtr)&name;
    xmlSchemaPValAttrNodeQName
              (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar10,(xmlAttrPtr)&refNs,(xmlChar **)attr_01,
               (xmlChar **)in_R9);
    pxVar13 = refNs;
    attr = (xmlAttrPtr)refNs;
    xmlSchemaCheckReference(ctxt,(xmlSchemaPtr)node,pxVar10,(xmlAttrPtr)refNs,(xmlChar *)attr_01);
    if (pxVar9 != (xmlAttrPtr)0x0) {
      attr_01 = (xmlAttrPtr)0x1e8ccc;
      in_R9 = (xmlSchemaTreeItemPtr_conflict *)0x1e5709;
      xmlSchemaPMutualExclAttrErr
                (ctxt,XML_SCHEMAP_SRC_ELEMENT_2_1,(xmlSchemaBasicItemPtr)0x0,pxVar9,"ref","name");
      attr = pxVar9;
    }
    pp_Var25 = &node->properties;
    while (p_Var2 = *pp_Var25, p_Var2 != (_xmlAttr *)0x0) {
      if (p_Var2->ns == (xmlNs *)0x0) {
        iVar8 = xmlStrEqual(p_Var2->name,"ref");
        if (((iVar8 == 0) && (iVar8 = xmlStrEqual(p_Var2->name,"name"), iVar8 == 0)) &&
           ((iVar8 = xmlStrEqual(p_Var2->name,"id"), iVar8 == 0 &&
            ((iVar8 = xmlStrEqual(p_Var2->name,(xmlChar *)"maxOccurs"), iVar8 == 0 &&
             (iVar8 = xmlStrEqual(p_Var2->name,(xmlChar *)"minOccurs"), iVar8 == 0)))))) {
          xmlSchemaPCustomAttrErr
                    (ctxt,XML_SCHEMAP_SRC_ELEMENT_2_2,(xmlChar **)p_Var2,
                     (xmlSchemaBasicItemPtr)
                     "Only the attributes \'minOccurs\', \'maxOccurs\' and \'id\' are allowed in addition to \'ref\'"
                     ,attr_01,(char *)in_R9);
          break;
        }
      }
      else {
        iVar8 = xmlStrEqual(p_Var2->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        if (iVar8 != 0) {
          xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var2,ownerComp,attr);
        }
      }
      pp_Var25 = &p_Var2->next;
    }
    if (schema_00 != (xmlSchemaPtr)0x0) {
      xmlSchemaPContentErr
                (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,
                 (xmlNodePtr)schema_00,(xmlNodePtr)0x0,"(annotation?)",
                 (char *)in_stack_ffffffffffffff58);
    }
    if ((iVar6 != 0 || uVar7 != 0) &&
       (pxVar21 = xmlSchemaNewQNameRef(ctxt,XML_SCHEMA_TYPE_ELEMENT,name,pxVar13),
       pxVar21 != (xmlSchemaQNameRefPtr)0x0)) {
      item->children = (xmlSchemaTreeItemPtr_conflict)pxVar21;
      item->annot = local_70;
      xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item);
      return (xmlSchemaBasicItemPtr)item;
    }
  }
  else {
    item = (xmlSchemaParticlePtr)0x0;
LAB_001add7d:
    pxVar11 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
    iVar6 = xmlSchemaPValAttrNode
                      (ctxt,(xmlSchemaBasicItemPtr)pxVar9,(xmlAttrPtr)pxVar11,
                       (xmlSchemaTypePtr)&name,(xmlChar **)child);
    if (iVar6 == 0) {
      if (topLevel == 0) {
        pxVar10 = (xmlNodePtr)xmlSchemaGetPropNode(node,"form");
        if (pxVar10 == (xmlNodePtr)0x0) {
          if ((schema->flags & 1) != 0) goto LAB_001adf7d;
          pxVar13 = (xmlChar *)0x0;
          uri = (char *)in_R9;
        }
        else {
          uri = (char *)xmlSchemaGetNodeContent(ctxt,pxVar10);
          iVar6 = xmlStrEqual((xmlChar *)uri,"qualified");
          if (iVar6 == 0) {
            iVar6 = xmlStrEqual((xmlChar *)uri,(xmlChar *)"unqualified");
            if (iVar6 == 0) {
              in_stack_ffffffffffffff58 = (xmlChar **)0x0;
              in_stack_ffffffffffffff60 = 0;
              child = "(qualified | unqualified)";
              pxVar13 = (xmlChar *)0x0;
              xmlSchemaPSimpleTypeErr
                        (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar10,
                         (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(qualified | unqualified)",uri,
                         (xmlChar *)0x0,(char *)0x0,(xmlChar *)in_stack_ffffffffffffff68,
                         (xmlChar *)in_stack_ffffffffffffff70);
            }
            else {
              pxVar13 = (xmlChar *)0x0;
              uri = (char *)in_R9;
            }
          }
          else {
            pxVar13 = ctxt->targetNamespace;
            uri = (char *)in_R9;
          }
        }
      }
      else {
LAB_001adf7d:
        pxVar13 = ctxt->targetNamespace;
        uri = (char *)in_R9;
      }
      pxVar5 = name;
      if (name != (xmlChar *)0x0) {
        __s = (xmlSchemaParticlePtr)(*xmlMalloc)(200);
        if (__s != (xmlSchemaParticlePtr)0x0) {
          pxVar17 = __s;
          memset(__s,0,200);
          __s->type = XML_SCHEMA_TYPE_ELEMENT;
          __s->next = (xmlSchemaTreeItemPtr_conflict)pxVar5;
          *(xmlChar **)(__s + 2) = pxVar13;
          __s[1].children = (xmlSchemaTreeItemPtr_conflict)node;
          attr_00 = (char *)ctxt->constructor->bucket;
          xmlSchemaAddItemSize
                    ((xmlSchemaItemListPtr *)(&((xmlAttrPtr)attr_00)->doc + (topLevel == 0)),
                     (uint)(topLevel == 0) * 5 + 5,__s);
          xmlSchemaAddItemSize(&ctxt->constructor->pending,10,__s);
          pp_Var25 = &node->properties;
          while( true ) {
            iVar6 = (int)in_stack_ffffffffffffff60;
            p_Var2 = *pp_Var25;
            if (p_Var2 == (_xmlAttr *)0x0) break;
            if (p_Var2->ns == (xmlNs *)0x0) {
              iVar6 = xmlStrEqual(p_Var2->name,"name");
              if (((iVar6 == 0) && (iVar6 = xmlStrEqual(p_Var2->name,"type"), iVar6 == 0)) &&
                 ((iVar6 = xmlStrEqual(p_Var2->name,"id"), iVar6 == 0 &&
                  ((((iVar6 = xmlStrEqual(p_Var2->name,"default"), iVar6 == 0 &&
                     (iVar6 = xmlStrEqual(p_Var2->name,(xmlChar *)"fixed"), iVar6 == 0)) &&
                    (iVar6 = xmlStrEqual(p_Var2->name,(xmlChar *)"block"), iVar6 == 0)) &&
                   (iVar6 = xmlStrEqual(p_Var2->name,(xmlChar *)"nillable"), iVar6 == 0)))))) {
                if (topLevel == 0) {
                  iVar6 = xmlStrEqual(p_Var2->name,(xmlChar *)"maxOccurs");
                  if ((iVar6 == 0) &&
                     (iVar6 = xmlStrEqual(p_Var2->name,(xmlChar *)"minOccurs"), iVar6 == 0)) {
                    pxVar13 = p_Var2->name;
                    str2 = "form";
                    goto LAB_001ae230;
                  }
                }
                else {
                  iVar6 = xmlStrEqual(p_Var2->name,(xmlChar *)"final");
                  if ((iVar6 == 0) && (iVar6 = xmlStrEqual(p_Var2->name,"abstract"), iVar6 == 0)) {
                    pxVar13 = p_Var2->name;
                    str2 = "substitutionGroup";
LAB_001ae230:
                    iVar6 = xmlStrEqual(pxVar13,(xmlChar *)str2);
                    pxVar24 = extraout_RDX_00;
                    if (iVar6 == 0) goto LAB_001ae124;
                  }
                }
              }
            }
            else {
              iVar6 = xmlStrEqual(p_Var2->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              pxVar24 = extraout_RDX;
              if (iVar6 != 0) {
LAB_001ae124:
                xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var2,pxVar24,(xmlAttrPtr)attr_00);
              }
            }
            pp_Var25 = &p_Var2->next;
          }
          pxVar29 = pxVar17;
          if (topLevel != 0) {
            *(byte *)&__s[1].node = *(byte *)&__s[1].node | 0x22;
            flags = &pxVar17[1].node;
            child = (char *)&pxVar17[2].minOccurs;
            uri = (char *)&pxVar17[2].children;
            attr_00 = "substitutionGroup";
            xmlSchemaPValAttrQName
                      (ctxt,schema,(xmlSchemaBasicItemPtr)node,(xmlNodePtr)"substitutionGroup",child
                       ,(xmlChar **)uri,in_stack_ffffffffffffff58);
            iVar8 = xmlGetBooleanProp(ctxt,node,"abstract",(int)attr_00);
            if (iVar8 != 0) {
              *(byte *)flags = *(byte *)flags | 0x10;
            }
            pxVar10 = (xmlNodePtr)xmlSchemaGetPropNode(node,"final");
            if (pxVar10 == (xmlNodePtr)0x0) {
              uVar7 = schema->flags;
              if ((uVar7 & 4) != 0) {
                pbVar1 = (byte *)((long)&pxVar17[1].node + 1);
                *pbVar1 = *pbVar1 | 0x80;
              }
              if ((uVar7 & 8) != 0) {
                pbVar1 = (byte *)((long)&pxVar17[1].node + 2);
                *pbVar1 = *pbVar1 | 1;
              }
            }
            else {
              ppxVar12 = (xmlSchemaTreeItemPtr_conflict *)xmlSchemaGetNodeContent(ctxt,pxVar10);
              in_stack_ffffffffffffff58 =
                   (xmlChar **)CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),0xffffffff);
              child = (char *)0xffffffffffffffff;
              attr_00 = (char *)0x10000;
              uri = (char *)0xffffffff;
              iVar8 = xmlSchemaPValAttrBlockFinal
                                ((xmlChar *)ppxVar12,(int *)flags,0x8000,0x10000,-1,-1,-1,iVar6);
              if (iVar8 != 0) {
                in_stack_ffffffffffffff58 = (xmlChar **)0x0;
                iVar6 = 0;
                child = "(#all | List of (extension | restriction))";
                attr_00 = (char *)0x0;
                xmlSchemaPSimpleTypeErr
                          (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar10,
                           (xmlNodePtr)0x0,
                           (xmlSchemaTypePtr)"(#all | List of (extension | restriction))",
                           (char *)ppxVar12,(xmlChar *)0x0,(char *)0x0,
                           (xmlChar *)in_stack_ffffffffffffff68,(xmlChar *)pxVar29);
                uri = (char *)ppxVar12;
              }
            }
          }
          iVar8 = (int)attr_00;
          pxVar10 = (xmlNodePtr)xmlSchemaGetPropNode(node,"block");
          if (pxVar10 == (xmlNodePtr)0x0) {
            uVar7 = schema->flags;
            if ((char)uVar7 < '\0') {
              pbVar1 = (byte *)((long)&__s[1].node + 1);
              *pbVar1 = *pbVar1 | 0x10;
            }
            if ((uVar7 & 0x40) != 0) {
              pbVar1 = (byte *)((long)&__s[1].node + 1);
              *pbVar1 = *pbVar1 | 8;
            }
            if ((uVar7 >> 8 & 1) != 0) {
              pbVar1 = (byte *)((long)&__s[1].node + 1);
              *pbVar1 = *pbVar1 | 0x20;
            }
          }
          else {
            ppxVar12 = (xmlSchemaTreeItemPtr_conflict *)xmlSchemaGetNodeContent(ctxt,pxVar10);
            in_stack_ffffffffffffff58 =
                 (xmlChar **)CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),0xffffffff);
            uri = (char *)0xffffffffffffffff;
            iVar8 = 0x1000;
            child = (char *)0x2000;
            iVar6 = xmlSchemaPValAttrBlockFinal
                              ((xmlChar *)ppxVar12,(int *)&pxVar29[1].node,0x800,0x1000,0x2000,-1,-1
                               ,iVar6);
            if (iVar6 != 0) {
              in_stack_ffffffffffffff58 = (xmlChar **)0x0;
              child = "(#all | List of (extension | restriction | substitution))";
              iVar8 = 0;
              xmlSchemaPSimpleTypeErr
                        (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar10,
                         (xmlNodePtr)0x0,
                         (xmlSchemaTypePtr)
                         "(#all | List of (extension | restriction | substitution))",
                         (char *)ppxVar12,(xmlChar *)0x0,(char *)0x0,
                         (xmlChar *)in_stack_ffffffffffffff68,(xmlChar *)pxVar29);
              uri = (char *)ppxVar12;
            }
          }
          iVar6 = xmlGetBooleanProp(ctxt,node,"nillable",iVar8);
          if (iVar6 != 0) {
            *(byte *)&__s[1].node = *(byte *)&__s[1].node | 1;
          }
          pxVar10 = (xmlNodePtr)xmlSchemaGetPropNode(node,"type");
          if (pxVar10 != (xmlNodePtr)0x0) {
            child = (char *)&pxVar29[2].annot;
            xmlSchemaPValAttrNodeQName
                      (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar10,(xmlAttrPtr)&pxVar29[2].next,
                       (xmlChar **)child,(xmlChar **)uri);
            xmlSchemaCheckReference
                      (ctxt,(xmlSchemaPtr)node,pxVar10,(xmlAttrPtr)__s[2].next,(xmlChar *)child);
          }
          pxVar13 = xmlSchemaGetProp(ctxt,node,"default");
          *(xmlChar **)(__s + 3) = pxVar13;
          pxVar10 = (xmlNodePtr)xmlSchemaGetPropNode(node,"fixed");
          if (pxVar10 != (xmlNodePtr)0x0) {
            pxVar13 = xmlSchemaGetNodeContent(ctxt,pxVar10);
            if (*(long *)(__s + 3) == 0) {
              *(byte *)&__s[1].node = *(byte *)&__s[1].node | 8;
              *(xmlChar **)(__s + 3) = pxVar13;
            }
            else {
              child = "default";
              uri = "fixed";
              xmlSchemaPMutualExclAttrErr
                        (ctxt,XML_SCHEMAP_SRC_ELEMENT_1,(xmlSchemaBasicItemPtr)0x0,
                         (xmlAttrPtr)pxVar10,"default","fixed");
            }
          }
          if (schema_00 == (xmlSchemaPtr)0x0) {
            schema_00 = (xmlSchemaPtr)0x0;
            goto LAB_001ae595;
          }
          if ((xmlNs *)schema_00->attrgrpDecl == (xmlNs *)0x0) goto LAB_001ae595;
          iVar6 = xmlStrEqual(schema_00->version,(xmlChar *)"complexType");
          if ((iVar6 == 0) ||
             (iVar6 = xmlStrEqual(((xmlNs *)schema_00->attrgrpDecl)->href,
                                  (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0)) {
            if (((xmlNs *)schema_00->attrgrpDecl == (xmlNs *)0x0) ||
               ((iVar6 = xmlStrEqual(schema_00->version,"simpleType"), iVar6 == 0 ||
                (iVar6 = xmlStrEqual(((xmlNs *)schema_00->attrgrpDecl)->href,
                                     (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0))))
            goto LAB_001ae595;
            if (__s[2].annot != (xmlSchemaAnnotPtr)0x0) {
              child = "The attribute \'type\' and the <simpleType> child are mutually exclusive";
              goto LAB_001ae54e;
            }
            pxVar11 = xmlSchemaParseSimpleType(ctxt,schema,(xmlNodePtr)schema_00,0);
LAB_001ae58c:
            __s[1].annot = (xmlSchemaAnnotPtr)pxVar11;
          }
          else {
            if (__s[2].annot == (xmlSchemaAnnotPtr)0x0) {
              pxVar11 = xmlSchemaParseComplexType(ctxt,schema,(xmlNodePtr)schema_00,0);
              goto LAB_001ae58c;
            }
            child = "The attribute \'type\' and the <complexType> child are mutually exclusive";
LAB_001ae54e:
            uri = (char *)0x0;
            xmlSchemaPContentErr
                      (ctxt,XML_SCHEMAP_SRC_ELEMENT_3,(xmlSchemaBasicItemPtr)node,
                       (xmlNodePtr)schema_00,(xmlNodePtr)child,(char *)0x0,
                       (char *)in_stack_ffffffffffffff58);
          }
          schema_00 = *(xmlSchemaPtr *)&schema_00->flags;
LAB_001ae595:
          pxVar29 = pxVar29 + 4;
          pxVar10 = (xmlNodePtr)0x0;
          do {
            if (schema_00 == (xmlSchemaPtr)0x0) {
LAB_001aebf2:
              *(xmlSchemaAnnotPtr *)(__s + 1) = local_70;
              if (topLevel == 0) {
                item->children = (xmlSchemaTreeItemPtr_conflict)__s;
                return (xmlSchemaBasicItemPtr)item;
              }
              return (xmlSchemaBasicItemPtr)__s;
            }
            if ((schema_00->attrgrpDecl == (xmlHashTablePtr)0x0) ||
               (((iVar6 = xmlStrEqual(schema_00->version,(xmlChar *)"unique"), iVar6 == 0 ||
                 (iVar6 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0))
                && ((schema_00->attrgrpDecl == (xmlHashTablePtr)0x0 ||
                    (((iVar6 = xmlStrEqual(schema_00->version,"key"), iVar6 == 0 ||
                      (iVar6 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                                           (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                      iVar6 == 0)) &&
                     ((schema_00->attrgrpDecl == (xmlHashTablePtr)0x0 ||
                      ((iVar6 = xmlStrEqual(schema_00->version,"keyref"), iVar6 == 0 ||
                       (iVar6 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                                            (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                       iVar6 == 0)))))))))))) {
              xmlSchemaPContentErr
                        (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,
                         (xmlNodePtr)schema_00,(xmlNodePtr)0x0,
                         "(annotation?, ((simpleType | complexType)?, (unique | key | keyref)*))",
                         (char *)in_stack_ffffffffffffff58);
              goto LAB_001aebf2;
            }
            pxVar23 = pxVar10;
            if (schema_00->attrgrpDecl != (xmlHashTablePtr)0x0) {
              pxVar14 = pxVar10;
              iVar6 = xmlStrEqual(schema_00->version,(xmlChar *)"unique");
              if ((iVar6 == 0) ||
                 (iVar6 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0)) {
                if (schema_00->attrgrpDecl != (xmlHashTablePtr)0x0) {
                  pxVar14 = pxVar10;
                  iVar6 = xmlStrEqual(schema_00->version,"key");
                  if ((iVar6 != 0) &&
                     (iVar6 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 != 0
                     )) {
                    uVar4 = 0x17;
                    goto LAB_001ae6f2;
                  }
                  if ((schema_00->attrgrpDecl != (xmlHashTablePtr)0x0) &&
                     (iVar6 = xmlStrEqual(schema_00->version,"keyref"), iVar6 != 0)) {
                    iVar6 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                    uVar28 = 1;
                    uVar4 = 0x18;
                    pxVar14 = pxVar10;
                    if (iVar6 != 0) goto LAB_001ae6f7;
                  }
                }
              }
              else {
                uVar4 = 0x16;
LAB_001ae6f2:
                uVar28 = 0;
LAB_001ae6f7:
                p_Var19 = *(_xmlNode **)(__s + 2);
                refNs = (xmlChar *)0x0;
                pxVar26 = (xmlHashTablePtr)&schema_00->notaDecl;
                while( true ) {
                  cVar27 = (char)uVar28;
                  pxVar3 = *(xmlDictPtr *)pxVar26;
                  if (pxVar3 == (xmlDictPtr)0x0) break;
                  if (pxVar3[1].dict == (_xmlDictEntry *)0x0) {
                    iVar6 = xmlStrEqual((xmlChar *)pxVar3->size,"id");
                    if (((iVar6 == 0) &&
                        (iVar6 = xmlStrEqual((xmlChar *)pxVar3->size,"name"), iVar6 == 0)) &&
                       ((pxVar24 = extraout_RDX_02, (char)uVar28 == '\0' ||
                        (iVar6 = xmlStrEqual((xmlChar *)pxVar3->size,"refer"),
                        pxVar24 = extraout_RDX_03, iVar6 == 0)))) goto LAB_001ae732;
                  }
                  else {
                    iVar6 = xmlStrEqual(*(xmlChar **)&(pxVar3[1].dict)->len,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                    pxVar24 = extraout_RDX_01;
                    if (iVar6 != 0) {
LAB_001ae732:
                      xmlSchemaPIllegalAttrErr
                                (ctxt,(xmlParserErrors)pxVar3,pxVar24,(xmlAttrPtr)pxVar14);
                    }
                  }
                  pxVar26 = (xmlHashTablePtr)&pxVar3->seed;
                }
                pxVar9 = xmlSchemaGetPropNode((xmlNodePtr)schema_00,"name");
                if (pxVar9 == (xmlAttrPtr)0x0) {
                  xmlSchemaPMissingAttrErr
                            (ctxt,(xmlParserErrors)schema_00,(xmlSchemaBasicItemPtr)0x1e5709,pxVar14
                             ,child,uri);
                }
                else {
                  pxVar11 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
                  iVar6 = xmlSchemaPValAttrNode
                                    (ctxt,(xmlSchemaBasicItemPtr)pxVar9,(xmlAttrPtr)pxVar11,
                                     (xmlSchemaTypePtr)&refNs,(xmlChar **)child);
                  pxVar13 = refNs;
                  if ((iVar6 == 0) && (refNs != (xmlChar *)0x0)) {
                    pxVar14 = (xmlNodePtr)(*xmlMalloc)(0x50);
                    if (pxVar14 != (xmlNodePtr)0x0) {
                      pxVar14->last = (_xmlNode *)0x0;
                      pxVar14->parent = (_xmlNode *)0x0;
                      pxVar14->_private = (void *)0x0;
                      *(undefined8 *)&pxVar14->type = 0;
                      pxVar14->name = (xmlChar *)0x0;
                      pxVar14->children = (_xmlNode *)0x0;
                      pxVar14->doc = (_xmlDoc *)0x0;
                      pxVar14->ns = (xmlNs *)0x0;
                      pxVar14->next = (_xmlNode *)0x0;
                      pxVar14->prev = (_xmlNode *)0x0;
                      pxVar14->parent = p_Var19;
                      pxVar14->last = (_xmlNode *)pxVar13;
                      *(undefined4 *)&pxVar14->_private = uVar4;
                      pxVar14->children = (_xmlNode *)schema_00;
                      pxVar23 = (xmlNodePtr)ctxt->constructor;
                      xmlSchemaAddItemSize((xmlSchemaItemListPtr *)&pxVar23->last->doc,5,pxVar14);
                      if (cVar27 == '\0') {
                        xmlSchemaPValAttrID(ctxt,(xmlNodePtr)schema_00,name_01);
                      }
                      else {
                        xmlSchemaAddItemSize(&ctxt->constructor->pending,10,pxVar14);
                        xmlSchemaPValAttrID(ctxt,(xmlNodePtr)schema_00,name_02);
                        pxVar15 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)schema_00,"refer");
                        if (pxVar15 == (xmlNodePtr)0x0) {
                          xmlSchemaPMissingAttrErr
                                    (ctxt,(xmlParserErrors)schema_00,(xmlSchemaBasicItemPtr)0x1dcd32
                                     ,pxVar23,child,uri);
                        }
                        else {
                          pxVar16 = (xmlNs *)xmlSchemaNewQNameRef
                                                       (ctxt,XML_SCHEMA_TYPE_IDC_KEY,(xmlChar *)0x0,
                                                        (xmlChar *)0x0);
                          pxVar14->ns = pxVar16;
                          pxVar23 = (xmlNodePtr)0x0;
                          if (pxVar16 == (xmlNs *)0x0) goto LAB_001ae95f;
                          child = (char *)&pxVar16->prefix;
                          xmlSchemaPValAttrNodeQName
                                    (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar15,
                                     (xmlAttrPtr)&pxVar16->_private,(xmlChar **)child,
                                     (xmlChar **)uri);
                          xmlSchemaCheckReference
                                    (ctxt,schema_00,pxVar15,(xmlAttrPtr)pxVar14->ns->_private,
                                     (xmlChar *)child);
                        }
                      }
                      pxVar15 = (xmlNodePtr)schema_00->id;
                      if (pxVar15 == (xmlNodePtr)0x0) {
LAB_001aeb64:
                        error = XML_SCHEMAP_S4S_ELEM_MISSING;
                        pxVar15 = (xmlNodePtr)0x0;
                        child = "A child element is missing";
                        pxVar23 = pxVar14;
                      }
                      else {
                        if (((pxVar15->ns != (xmlNs *)0x0) &&
                            (iVar6 = xmlStrEqual(pxVar15->name,"annotation"), iVar6 != 0)) &&
                           (iVar6 = xmlStrEqual(pxVar15->ns->href,
                                                (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                           iVar6 != 0)) {
                          pxVar18 = xmlSchemaParseAnnotation(ctxt,pxVar15,1);
                          *(xmlSchemaAnnotPtr *)&pxVar14->type = pxVar18;
                          pxVar15 = pxVar15->next;
                          if (pxVar15 == (_xmlNode *)0x0) goto LAB_001aeb64;
                        }
                        if (((pxVar15->ns != (xmlNs *)0x0) &&
                            (iVar6 = xmlStrEqual(pxVar15->name,(xmlChar *)"selector"), iVar6 != 0))
                           && (iVar6 = xmlStrEqual(pxVar15->ns->href,
                                                   (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                              iVar6 != 0)) {
                          p_Var19 = (_xmlNode *)
                                    xmlSchemaParseIDCSelectorAndField
                                              (ctxt,(xmlSchemaIDCPtr_conflict)pxVar14,pxVar15,0);
                          pxVar14->next = p_Var19;
                          pxVar15 = pxVar15->next;
                          if (pxVar15 == (xmlNodePtr)0x0) {
                            pxVar15 = (xmlNodePtr)0x0;
                          }
                          else if (((pxVar15->ns == (xmlNs *)0x0) ||
                                   (iVar6 = xmlStrEqual(pxVar15->name,(xmlChar *)"field"),
                                   iVar6 == 0)) ||
                                  (iVar6 = xmlStrEqual(pxVar15->ns->href,
                                                       (xmlChar *)"http://www.w3.org/2001/XMLSchema"
                                                      ), iVar6 == 0)) {
                            xmlSchemaPContentErr
                                      (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                                       (xmlSchemaBasicItemPtr)schema_00,pxVar15,(xmlNodePtr)0x0,
                                       "(annotation?, (selector, field+))",
                                       (char *)in_stack_ffffffffffffff58);
                          }
                          else {
                            local_38 = (_xmlSchemaType *)&pxVar14->prev;
                            local_50 = (_xmlSchemaType *)0x0;
                            pxVar23 = pxVar14;
                            do {
                              pxVar14 = pxVar23;
                              p_Var20 = (_xmlSchemaType *)
                                        xmlSchemaParseIDCSelectorAndField
                                                  (ctxt,(xmlSchemaIDCPtr_conflict)pxVar23,pxVar15,1)
                              ;
                              if (p_Var20 != (_xmlSchemaType *)0x0) {
                                iVar6 = *(int *)&pxVar23->doc;
                                *(int *)&p_Var20->name = iVar6;
                                *(int *)&pxVar23->doc = iVar6 + 1;
                                if (local_50 == (_xmlSchemaType *)0x0) {
                                  local_50 = local_38;
                                }
                                *(_xmlSchemaType **)local_50 = p_Var20;
                                local_50 = p_Var20;
                              }
                              pxVar15 = pxVar15->next;
                              if (pxVar15 == (xmlNodePtr)0x0) goto LAB_001ae95f;
                            } while (((pxVar15->ns != (xmlNs *)0x0) &&
                                     (iVar6 = xmlStrEqual(pxVar15->name,(xmlChar *)"field"),
                                     iVar6 != 0)) &&
                                    (iVar6 = xmlStrEqual(pxVar15->ns->href,
                                                         (xmlChar *)
                                                         "http://www.w3.org/2001/XMLSchema"),
                                    pxVar23 = pxVar14, iVar6 != 0));
                          }
                        }
                        error = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
                        child = (char *)0x0;
                        pxVar23 = pxVar14;
                      }
                      uri = "(annotation?, (selector, field+))";
                      xmlSchemaPContentErr
                                (ctxt,error,(xmlSchemaBasicItemPtr)schema_00,pxVar15,
                                 (xmlNodePtr)child,"(annotation?, (selector, field+))",
                                 (char *)in_stack_ffffffffffffff58);
                      goto LAB_001ae95f;
                    }
                    xmlSchemaPErrMemory(ctxt,"allocating an identity-constraint definition",
                                        (xmlNodePtr)0x0);
                  }
                }
                pxVar23 = (xmlNodePtr)0x0;
              }
            }
LAB_001ae95f:
            pxVar17 = (xmlSchemaParticlePtr)&pxVar10->name;
            if (pxVar10 == (xmlNodePtr)0x0) {
              pxVar17 = pxVar29;
            }
            *(xmlNodePtr *)pxVar17 = pxVar23;
            schema_00 = *(xmlSchemaPtr *)&schema_00->flags;
            pxVar10 = pxVar23;
          } while( true );
        }
        xmlSchemaPErrMemory(ctxt,"allocating element",(xmlNodePtr)0x0);
      }
    }
  }
  if (local_70 == (xmlSchemaAnnotPtr)0x0) {
    return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
  }
  if (item != (xmlSchemaParticlePtr)0x0) {
    item->annot = (xmlSchemaAnnotPtr)0x0;
  }
LAB_001adf93:
  xmlSchemaFreeAnnot(local_70);
  return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaParseElement(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                      xmlNodePtr node, int *isElemRef, int topLevel)
{
    xmlSchemaElementPtr decl = NULL;
    xmlSchemaParticlePtr particle = NULL;
    xmlSchemaAnnotPtr annot = NULL;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr, nameAttr;
    int min, max, isRef = 0;
    xmlChar *des = NULL;

    /* 3.3.3 Constraints on XML Representations of Element Declarations */
    /* TODO: Complete implementation of 3.3.6 */

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    if (isElemRef != NULL)
	*isElemRef = 0;
    /*
    * If we get a "ref" attribute on a local <element> we will assume it's
    * a reference - even if there's a "name" attribute; this seems to be more
    * robust.
    */
    nameAttr = xmlSchemaGetPropNode(node, "name");
    attr = xmlSchemaGetPropNode(node, "ref");
    if ((topLevel) || (attr == NULL)) {
	if (nameAttr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING,
		NULL, node, "name", NULL);
	    return (NULL);
	}
    } else
	isRef = 1;

    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    /*
    * Skip particle part if a global declaration.
    */
    if (topLevel)
	goto declaration_part;
    /*
    * The particle part ==================================================
    */
    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1, "(xs:nonNegativeInteger | unbounded)");
    xmlSchemaPCheckParticleCorrect_2(ctxt, NULL, node, min, max);
    particle = xmlSchemaAddParticle(ctxt, node, min, max);
    if (particle == NULL)
	goto return_null;

    /* ret->flags |= XML_SCHEMAS_ELEM_REF; */

    if (isRef) {
	const xmlChar *refNs = NULL, *ref = NULL;
	xmlSchemaQNameRefPtr refer = NULL;
	/*
	* The reference part =============================================
	*/
	if (isElemRef != NULL)
	    *isElemRef = 1;

	xmlSchemaPValAttrNodeQName(ctxt, schema,
	    NULL, attr, &refNs, &ref);
	xmlSchemaCheckReference(ctxt, schema, node, attr, refNs);
	/*
	* SPEC (3.3.3 : 2.1) "One of ref or name must be present, but not both"
	*/
	if (nameAttr != NULL) {
	    xmlSchemaPMutualExclAttrErr(ctxt,
		XML_SCHEMAP_SRC_ELEMENT_2_1, NULL, nameAttr, "ref", "name");
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (xmlStrEqual(attr->name, BAD_CAST "ref") ||
		    xmlStrEqual(attr->name, BAD_CAST "name") ||
		    xmlStrEqual(attr->name, BAD_CAST "id") ||
		    xmlStrEqual(attr->name, BAD_CAST "maxOccurs") ||
		    xmlStrEqual(attr->name, BAD_CAST "minOccurs"))
		{
		    attr = attr->next;
		    continue;
		} else {
		    /* SPEC (3.3.3 : 2.2) */
		    xmlSchemaPCustomAttrErr(ctxt,
			XML_SCHEMAP_SRC_ELEMENT_2_2,
			NULL, NULL, attr,
			"Only the attributes 'minOccurs', 'maxOccurs' and "
			"'id' are allowed in addition to 'ref'");
		    break;
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* No children except <annotation> expected.
	*/
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL, "(annotation?)");
	}
	if ((min == 0) && (max == 0))
	    goto return_null;
	/*
	* Create the reference item and attach it to the particle.
	*/
	refer = xmlSchemaNewQNameRef(ctxt, XML_SCHEMA_TYPE_ELEMENT,
	    ref, refNs);
	if (refer == NULL)
	    goto return_null;
	particle->children = (xmlSchemaTreeItemPtr) refer;
	particle->annot = annot;
	/*
	* Add the particle to pending components, since the reference
	* need to be resolved.
	*/
	WXS_ADD_PENDING(ctxt, particle);
	return ((xmlSchemaBasicItemPtr) particle);
    }
    /*
    * The declaration part ===============================================
    */
declaration_part:
    {
	const xmlChar *ns = NULL, *fixed, *name, *attrValue;
	xmlSchemaIDCPtr curIDC = NULL, lastIDC = NULL;

	if (xmlSchemaPValAttrNode(ctxt, NULL, nameAttr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0)
	    goto return_null;
	/*
	* Evaluate the target namespace.
	*/
	if (topLevel) {
	    ns = ctxt->targetNamespace;
	} else {
	    attr = xmlSchemaGetPropNode(node, "form");
	    if (attr != NULL) {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlStrEqual(attrValue, BAD_CAST "qualified")) {
		    ns = ctxt->targetNamespace;
		} else if (!xmlStrEqual(attrValue, BAD_CAST "unqualified")) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(qualified | unqualified)",
			attrValue, NULL, NULL, NULL);
		}
	    } else if (schema->flags & XML_SCHEMAS_QUALIF_ELEM)
		ns = ctxt->targetNamespace;
	}
	decl = xmlSchemaAddElement(ctxt, name, ns, node, topLevel);
	if (decl == NULL) {
	    goto return_null;
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "type")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "default")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "fixed")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "block")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "nillable")))
		{
		    if (topLevel == 0) {
			if ((!xmlStrEqual(attr->name, BAD_CAST "maxOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "minOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "form")))
			{
			    xmlSchemaPIllegalAttrErr(ctxt,
				XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
			}
		    } else if ((!xmlStrEqual(attr->name, BAD_CAST "final")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "abstract")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "substitutionGroup"))) {

			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {

		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* Extract/validate attributes.
	*/
	if (topLevel) {
	    /*
	    * Process top attributes of global element declarations here.
	    */
	    decl->flags |= XML_SCHEMAS_ELEM_GLOBAL;
	    decl->flags |= XML_SCHEMAS_ELEM_TOPLEVEL;
	    xmlSchemaPValAttrQName(ctxt, schema,
		NULL, node, "substitutionGroup",
		&(decl->substGroupNs), &(decl->substGroup));
	    if (xmlGetBooleanProp(ctxt, node, "abstract", 0))
		decl->flags |= XML_SCHEMAS_ELEM_ABSTRACT;
	    /*
	    * Attribute "final".
	    */
	    attr = xmlSchemaGetPropNode(node, "final");
	    if (attr == NULL) {
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_EXTENSION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_EXTENSION;
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_RESTRICTION;
	    } else {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		    -1,
		    XML_SCHEMAS_ELEM_FINAL_EXTENSION,
		    XML_SCHEMAS_ELEM_FINAL_RESTRICTION, -1, -1, -1) != 0) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(#all | List of (extension | restriction))",
			attrValue, NULL, NULL, NULL);
		}
	    }
	}
	/*
	* Attribute "block".
	*/
	attr = xmlSchemaGetPropNode(node, "block");
	if (attr == NULL) {
	    /*
	    * Apply default "block" values.
	    */
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_RESTRICTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_RESTRICTION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_EXTENSION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_EXTENSION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_SUBSTITUTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION;
	} else {
	    attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		-1,
		XML_SCHEMAS_ELEM_BLOCK_EXTENSION,
		XML_SCHEMAS_ELEM_BLOCK_RESTRICTION,
		XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION, -1, -1) != 0) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    NULL, (xmlNodePtr) attr,
		    NULL, "(#all | List of (extension | "
		    "restriction | substitution))", attrValue,
		    NULL, NULL, NULL);
	    }
	}
	if (xmlGetBooleanProp(ctxt, node, "nillable", 0))
	    decl->flags |= XML_SCHEMAS_ELEM_NILLABLE;

	attr = xmlSchemaGetPropNode(node, "type");
	if (attr != NULL) {
	    xmlSchemaPValAttrNodeQName(ctxt, schema,
		NULL, attr,
		&(decl->namedTypeNs), &(decl->namedType));
	    xmlSchemaCheckReference(ctxt, schema, node,
		attr, decl->namedTypeNs);
	}
	decl->value = xmlSchemaGetProp(ctxt, node, "default");
	attr = xmlSchemaGetPropNode(node, "fixed");
	if (attr != NULL) {
	    fixed = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (decl->value != NULL) {
		/*
		* 3.3.3 : 1
		* default and fixed must not both be present.
		*/
		xmlSchemaPMutualExclAttrErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_1,
		    NULL, attr, "default", "fixed");
	    } else {
		decl->flags |= XML_SCHEMAS_ELEM_FIXED;
		decl->value = fixed;
	    }
	}
	/*
	* And now for the children...
	*/
	if (IS_SCHEMA(child, "complexType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are mutually
	    * exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <complexType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseComplexType(ctxt, schema, child, 0);
	    child = child->next;
	} else if (IS_SCHEMA(child, "simpleType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are
	    * mutually exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <simpleType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseSimpleType(ctxt, schema, child, 0);
	    child = child->next;
	}
	while ((IS_SCHEMA(child, "unique")) ||
	    (IS_SCHEMA(child, "key")) || (IS_SCHEMA(child, "keyref"))) {
	    if (IS_SCHEMA(child, "unique")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_UNIQUE, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "key")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEY, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "keyref")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEYREF, decl->targetNamespace);
	    }
	    if (lastIDC != NULL)
		lastIDC->next = curIDC;
	    else
		decl->idcs = (void *) curIDC;
	    lastIDC = curIDC;
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child,
		NULL, "(annotation?, ((simpleType | complexType)?, "
		"(unique | key | keyref)*))");
	}
	decl->annot = annot;
    }
    /*
    * NOTE: Element Declaration Representation OK 4. will be checked at a
    * different layer.
    */
    FREE_AND_NULL(des)
    if (topLevel)
	return ((xmlSchemaBasicItemPtr) decl);
    else {
	particle->children = (xmlSchemaTreeItemPtr) decl;
	return ((xmlSchemaBasicItemPtr) particle);
    }

return_null:
    FREE_AND_NULL(des);
    if (annot != NULL) {
	if (particle != NULL)
	    particle->annot = NULL;
	if (decl != NULL)
	    decl->annot = NULL;
	xmlSchemaFreeAnnot(annot);
    }
    return (NULL);
}